

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O3

token_code get_token_code(string *token)

{
  int iVar1;
  token_code tVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)token);
  if (iVar1 == 0) {
    tVar2 = ambient;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)token);
    if (iVar1 == 0) {
      tVar2 = diffuse;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)token);
      if (iVar1 == 0) {
        tVar2 = specular;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)token);
        if (iVar1 == 0) {
          tVar2 = set_pu;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)token);
          if (iVar1 == 0) {
            tVar2 = set_pv;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)token);
            if (iVar1 == 0) {
              tVar2 = set_p;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)token);
              if (iVar1 == 0) {
                tVar2 = add_dl;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)token);
                if (iVar1 == 0) {
                  tVar2 = add_pl;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)token);
                  if (iVar1 == 0) {
                    tVar2 = toon;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)token);
                    if (iVar1 == 0) {
                      tVar2 = set_toon_layers;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)token);
                      if (iVar1 == 0) {
                        tVar2 = set_depth;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)token);
                        if (iVar1 == 0) {
                          tVar2 = set_dd;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)token);
                          if (iVar1 == 0) {
                            tVar2 = set_ds;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)token);
                            tVar2 = set_sketch;
                            if (iVar1 != 0) {
                              tVar2 = not_specified;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tVar2;
}

Assistant:

token_code get_token_code(string const& token){
    if (token == "-ka") return ambient;
    if (token == "-kd") return diffuse;
    if (token == "-ks") return specular;
    if (token == "-spu") return set_pu;
    if (token == "-spv") return set_pv;
    if (token == "-sp") return set_p;
    if (token == "-dl") return add_dl;
    if (token == "-pl") return add_pl;
    if (token == "-toon") return toon;
    if (token == "-toonl") return set_toon_layers;
    if (token == "-transludepth") return set_depth;
    if (token == "-transludd") return set_dd;
    if (token == "-transluds") return set_ds;
    if (token == "-sketch") return set_sketch;
    return not_specified;
}